

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)1>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  allocator<int> *paVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  double *pdVar10;
  reference pvVar11;
  int *piVar12;
  size_type sVar13;
  double *__result;
  reference pvVar14;
  int *piVar15;
  pointer *this_00;
  Data2D<double> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  iterator iVar16;
  _Bit_iterator _Var17;
  reference rVar18;
  bool local_495;
  int local_394;
  int local_360;
  int k_3;
  bool small_1;
  double *v;
  double *c_1;
  double *s_1;
  undefined1 auStack_338 [4];
  int i_5;
  _Bit_type local_330;
  int local_324;
  double *pdStack_320;
  int k_2;
  double *branch_vals_1;
  double basis_value_1;
  int *branch_point_1;
  _Bit_type local_300;
  int local_2f4;
  _Bit_type *p_Stack_2f0;
  int branch_1;
  uint local_2e8;
  bool local_2d9;
  _Bit_type *local_2d8;
  uint local_2d0;
  _Bit_type *local_2c8;
  uint local_2c0;
  int local_2b4;
  double *pdStack_2b0;
  int current;
  double *valsi_1;
  double x_1;
  int local_298;
  int i_4;
  int l_1;
  int k_1;
  double *branch_vals;
  double basis_value;
  int *branch_point;
  double *pdStack_270;
  int branch;
  double *valsi;
  double x;
  int i_3;
  int l;
  int i_2;
  int i_1;
  Data2D<double> vals;
  int max_level;
  int *pnts;
  int nump;
  int d;
  int j;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  undefined1 local_1a8 [8];
  vector<int,_std::allocator<int>_> levels;
  undefined1 local_188 [8];
  vector<int,_std::allocator<int>_> global_to_pnts;
  undefined1 local_168 [4];
  int max_nump;
  SplitDirections split;
  undefined1 local_130 [4];
  int max_1D_parents;
  Data2D<int> dagUp;
  int k;
  double *c;
  double *s;
  undefined1 auStack_e8 [3];
  bool small;
  int i;
  allocator<double> local_d1;
  value_type_conflict2 local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  undefined1 local_b0 [8];
  vector<double,_std::allocator<double>_> default_scale;
  Wrapper2D<const_double> scale;
  undefined1 local_80 [4];
  int active_outputs;
  vector<double,_std::allocator<double>_> norm;
  allocator<int> local_55;
  uint local_54;
  vector<int,_std::allocator<int>_> local_50;
  byte local_35;
  int local_34;
  double *pdStack_30;
  int num_points;
  double *scale_correction_local;
  int output_local;
  TypeRefinement criteria_local;
  double tolerance_local;
  GridLocalPolynomial *this_local;
  Data2D<int> *pmap;
  
  pdStack_30 = scale_correction;
  scale_correction_local._0_4_ = output;
  scale_correction_local._4_4_ = criteria;
  _output_local = tolerance;
  tolerance_local = (double)this;
  this_local = (GridLocalPolynomial *)__return_storage_ptr__;
  iVar5 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  local_35 = 0;
  iVar6 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_34 = iVar5;
  sVar9 = Utils::size_mult<int,int>(iVar6,iVar5);
  local_54 = -(uint)(_output_local == 0.0) & 1;
  ::std::allocator<int>::allocator(&local_55);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_50,sVar9,(value_type_conflict3 *)&local_54,&local_55);
  Data2D<int>::Data2D<int,int>(__return_storage_ptr__,iVar6,iVar5,&local_50);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_50);
  ::std::allocator<int>::~allocator(&local_55);
  if ((_output_local != 0.0) || (NAN(_output_local))) {
    getNormalization((vector<double,_std::allocator<double>_> *)local_80,this);
    if ((int)scale_correction_local == -1) {
      local_394 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    else {
      local_394 = 1;
    }
    Utils::Wrapper2D<const_double>::Wrapper2D
              ((Wrapper2D<const_double> *)
               &default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_394,pdStack_30);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_b0);
    if (pdStack_30 == (double *)0x0) {
      sVar9 = Utils::size_mult<int,int>(local_394,local_34);
      local_d0 = 1.0;
      ::std::allocator<double>::allocator(&local_d1);
      ::std::vector<double,_std::allocator<double>_>::vector(&local_c8,sVar9,&local_d0,&local_d1);
      ::std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_b0,&local_c8);
      ::std::vector<double,_std::allocator<double>_>::~vector(&local_c8);
      ::std::allocator<double>::~allocator(&local_d1);
      pdVar10 = ::std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)local_b0);
      Utils::Wrapper2D<const_double>::Wrapper2D
                ((Wrapper2D<const_double> *)auStack_e8,local_394,pdVar10);
      default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = _auStack_e8;
      Utils::Wrapper2D<const_double>::~Wrapper2D((Wrapper2D<const_double> *)auStack_e8);
    }
    if ((scale_correction_local._4_4_ == refine_classic) ||
       (scale_correction_local._4_4_ == refine_parents_first)) {
      for (s._4_4_ = 0; s._4_4_ < local_34; s._4_4_ = s._4_4_ + 1) {
        bVar3 = true;
        Data2D<double>::getStrip(&this->surpluses,s._4_4_);
        this_00 = &default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pdVar10 = Utils::Wrapper2D<const_double>::getStrip
                            ((Wrapper2D<const_double> *)this_00,s._4_4_);
        if ((int)scale_correction_local == -1) {
          for (dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ <
              (this->super_BaseCanonicalGrid).num_outputs;
              dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ =
                   dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
            bVar4 = false;
            if (bVar3) {
              dVar2 = pdVar10[dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_];
              ::std::abs((int)this_00);
              this_00 = (pointer *)local_80;
              pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)this_00,
                                   (long)dagUp.vec.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              bVar4 = (dVar2 * extraout_XMM0_Qa) / *pvVar11 <= _output_local;
            }
            bVar3 = bVar4;
          }
        }
        else {
          dVar2 = *pdVar10;
          ::std::abs((int)this_00);
          pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_80,
                               (long)(int)scale_correction_local);
          bVar3 = (dVar2 * extraout_XMM0_Qa_00) / *pvVar11 <= _output_local;
        }
        if (!bVar3) {
          piVar12 = Data2D<int>::getStrip(__return_storage_ptr__,s._4_4_);
          dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
          ::std::fill_n<int*,int,int>
                    (piVar12,(this->super_BaseCanonicalGrid).num_dimensions,
                     (int *)&dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
    else {
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)1>
                ((Data2D<int> *)local_130,&(this->super_BaseCanonicalGrid).points);
      split.job_pnts.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           RuleLocal::getMaxNumParents<(TasGrid::RuleLocal::erule)1>();
      HierarchyManipulations::SplitDirections::SplitDirections
                ((SplitDirections *)local_168,&(this->super_BaseCanonicalGrid).points);
      global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           HierarchyManipulations::SplitDirections::getMaxNumPoints((SplitDirections *)local_168);
      sVar13 = (size_type)local_34;
      paVar1 = (allocator<int> *)
               ((long)&levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
      ::std::allocator<int>::allocator(paVar1);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_188,sVar13,paVar1);
      ::std::allocator<int>::~allocator
                ((allocator<int> *)
                 ((long)&levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      sVar13 = (size_type)
               global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
      paVar1 = (allocator<int> *)
               ((long)&monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
      ::std::allocator<int>::allocator(paVar1);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_1a8,sVar13,paVar1);
      ::std::allocator<int>::~allocator
                ((allocator<int> *)
                 ((long)&monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      ::std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)&d);
      if (1 < split.job_pnts.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
        ::std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   &monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(long)(this->top_level + 1));
        ::std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   &used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_end_of_storage,(long)(this->top_level + 1));
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)&d,
                   (long)global_to_pnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,false);
      }
      nump = 0;
      while( true ) {
        iVar6 = HierarchyManipulations::SplitDirections::getNumJobs((SplitDirections *)local_168);
        if (iVar6 <= nump) break;
        iVar6 = HierarchyManipulations::SplitDirections::getJobDirection
                          ((SplitDirections *)local_168,nump);
        iVar5 = HierarchyManipulations::SplitDirections::getJobNumPoints
                          ((SplitDirections *)local_168,nump);
        piVar12 = HierarchyManipulations::SplitDirections::getJobPoints
                            ((SplitDirections *)local_168,nump);
        vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_ = 0;
        Data2D<double>::Data2D<int,int>((Data2D<double> *)&i_2,local_394,iVar5);
        if ((int)scale_correction_local == -1) {
          for (l = 0; l < iVar5; l = l + 1) {
            pdVar10 = StorageSet::getValues(&(this->super_BaseCanonicalGrid).values,piVar12[l]);
            iVar8 = (this->super_BaseCanonicalGrid).num_outputs;
            __result = Data2D<double>::getStrip((Data2D<double> *)&i_2,l);
            ::std::copy_n<double_const*,int,double*>(pdVar10,iVar8,__result);
            iVar8 = l;
            pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_188,(long)piVar12[l]);
            *pvVar14 = iVar8;
            piVar15 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,piVar12[l]);
            iVar7 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)1>(piVar15[iVar6]);
            pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_1a8,(long)l);
            iVar8 = vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
            *pvVar14 = iVar7;
            pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_1a8,(long)l);
            if (iVar8 < *pvVar14) {
              pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1a8,(long)l);
              vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar14;
            }
          }
        }
        else {
          for (i_3 = 0; i_3 < iVar5; i_3 = i_3 + 1) {
            pdVar10 = StorageSet::getValues(&(this->super_BaseCanonicalGrid).values,piVar12[i_3]);
            dVar2 = pdVar10[(int)scale_correction_local];
            pdVar10 = Data2D<double>::getStrip((Data2D<double> *)&i_2,i_3);
            iVar8 = i_3;
            *pdVar10 = dVar2;
            pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_188,(long)piVar12[i_3]);
            *pvVar14 = iVar8;
            piVar15 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,piVar12[i_3]);
            iVar7 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)1>(piVar15[iVar6]);
            pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_1a8,(long)i_3);
            iVar8 = vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
            *pvVar14 = iVar7;
            pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_1a8,(long)i_3);
            if (iVar8 < *pvVar14) {
              pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1a8,(long)i_3);
              vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar14;
            }
          }
        }
        if (split.job_pnts.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
          for (x._4_4_ = 1;
              x._4_4_ <=
              vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_; x._4_4_ = x._4_4_ + 1) {
            for (x._0_4_ = 0; x._0_4_ < iVar5; x._0_4_ = x._0_4_ + 1) {
              pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1a8,(long)x._0_4_);
              if (*pvVar14 == x._4_4_) {
                piVar15 = MultiIndexSet::getIndex
                                    (&(this->super_BaseCanonicalGrid).points,piVar12[x._0_4_]);
                valsi = (double *)RuleLocal::getNode<(TasGrid::RuleLocal::erule)1>(piVar15[iVar6]);
                pdStack_270 = Data2D<double>::getStrip((Data2D<double> *)&i_2,x._0_4_);
                piVar15 = Data2D<int>::getStrip((Data2D<int> *)local_130,piVar12[x._0_4_]);
                branch_point._4_4_ = piVar15[iVar6];
                while (branch_point._4_4_ != -1) {
                  basis_value = (double)MultiIndexSet::getIndex
                                                  (&(this->super_BaseCanonicalGrid).points,
                                                   branch_point._4_4_);
                  branch_vals = (double *)
                                RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)1>
                                          (this->order,*(int *)((long)basis_value + (long)iVar6 * 4)
                                           ,(double)valsi);
                  pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)local_188,
                                       (long)branch_point._4_4_);
                  _l_1 = Data2D<double>::getStrip((Data2D<double> *)&i_2,*pvVar14);
                  for (i_4 = 0; i_4 < local_394; i_4 = i_4 + 1) {
                    pdStack_270[i_4] = -(double)branch_vals * _l_1[i_4] + pdStack_270[i_4];
                  }
                  piVar15 = Data2D<int>::getStrip((Data2D<int> *)local_130,branch_point._4_4_);
                  branch_point._4_4_ = piVar15[iVar6];
                }
              }
            }
          }
        }
        else {
          for (local_298 = 1;
              local_298 <=
              vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_; local_298 = local_298 + 1) {
            for (x_1._4_4_ = 0; x_1._4_4_ < iVar5; x_1._4_4_ = x_1._4_4_ + 1) {
              pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1a8,(long)x_1._4_4_);
              if (*pvVar14 == local_298) {
                piVar15 = MultiIndexSet::getIndex
                                    (&(this->super_BaseCanonicalGrid).points,piVar12[x_1._4_4_]);
                valsi_1 = (double *)RuleLocal::getNode<(TasGrid::RuleLocal::erule)1>(piVar15[iVar6])
                ;
                pdStack_2b0 = Data2D<double>::getStrip((Data2D<double> *)&i_2,x_1._4_4_);
                local_2b4 = 0;
                iVar8 = iVar6 * split.job_pnts.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     &monkey_tail.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,0);
                *pvVar14 = iVar8;
                iVar8 = piVar12[x_1._4_4_];
                pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     &used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_end_of_storage,0);
                *pvVar14 = iVar8;
                iVar16 = ::std::vector<bool,_std::allocator<bool>_>::begin
                                   ((vector<bool,_std::allocator<bool>_> *)&d);
                local_2d8 = iVar16.super__Bit_iterator_base._M_p;
                local_2d0 = iVar16.super__Bit_iterator_base._M_offset;
                local_2d9 = false;
                _Var17.super__Bit_iterator_base._12_4_ = 0;
                _Var17.super__Bit_iterator_base._M_p =
                     (_Bit_type *)SUB128(iVar16.super__Bit_iterator_base._0_12_,0);
                _Var17.super__Bit_iterator_base._M_offset =
                     SUB124(iVar16.super__Bit_iterator_base._0_12_,8);
                local_2c8 = local_2d8;
                local_2c0 = local_2d0;
                _Var17 = ::std::fill_n<std::_Bit_iterator,int,bool>(_Var17,iVar5,&local_2d9);
                p_Stack_2f0 = _Var17.super__Bit_iterator_base._M_p;
                local_2e8 = _Var17.super__Bit_iterator_base._M_offset;
                while( true ) {
                  pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       &monkey_tail.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,0);
                  if ((iVar6 + 1) *
                      split.job_pnts.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <= *pvVar14) break;
                  pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       &monkey_tail.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)local_2b4);
                  if (*pvVar14 <
                      (iVar6 + 1) *
                      split.job_pnts.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
                    pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         &used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                          super__Bvector_impl_data._M_end_of_storage,(long)local_2b4
                                        );
                    piVar15 = Data2D<int>::getStrip((Data2D<int> *)local_130,*pvVar14);
                    pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         &monkey_tail.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (long)local_2b4);
                    local_2f4 = piVar15[*pvVar14];
                    local_495 = true;
                    if (local_2f4 != -1) {
                      pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)local_188,
                                           (long)local_2f4);
                      rVar18 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                         ((vector<bool,_std::allocator<bool>_> *)&d,(long)*pvVar14);
                      local_300 = rVar18._M_mask;
                      branch_point_1 = (int *)rVar18._M_p;
                      local_495 = ::std::_Bit_reference::operator_cast_to_bool
                                            ((_Bit_reference *)&branch_point_1);
                    }
                    if (local_495 == false) {
                      basis_value_1 =
                           (double)MultiIndexSet::getIndex
                                             (&(this->super_BaseCanonicalGrid).points,local_2f4);
                      branch_vals_1 =
                           (double *)
                           RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)1>
                                     (this->order,*(int *)((long)basis_value_1 + (long)iVar6 * 4),
                                      (double)valsi_1);
                      pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)local_188,
                                           (long)local_2f4);
                      pdStack_320 = Data2D<double>::getStrip((Data2D<double> *)&i_2,*pvVar14);
                      for (local_324 = 0; local_324 < local_394; local_324 = local_324 + 1) {
                        pdStack_2b0[local_324] =
                             -(double)branch_vals_1 * pdStack_320[local_324] +
                             pdStack_2b0[local_324];
                      }
                      pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)local_188,
                                           (long)local_2f4);
                      rVar18 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                         ((vector<bool,_std::allocator<bool>_> *)&d,(long)*pvVar14);
                      _auStack_338 = rVar18;
                      ::std::_Bit_reference::operator=((_Bit_reference *)auStack_338,true);
                      iVar7 = iVar6 * split.job_pnts.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                      local_2b4 = local_2b4 + 1;
                      pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           &monkey_tail.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage,
                                           (long)local_2b4);
                      iVar8 = local_2f4;
                      *pvVar14 = iVar7;
                      pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           &used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                            super__Bvector_impl_data._M_end_of_storage,
                                           (long)local_2b4);
                      *pvVar14 = iVar8;
                    }
                    else {
                      pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           &monkey_tail.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage,
                                           (long)local_2b4);
                      *pvVar14 = *pvVar14 + 1;
                    }
                  }
                  else {
                    local_2b4 = local_2b4 + -1;
                    pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         &monkey_tail.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (long)local_2b4);
                    *pvVar14 = *pvVar14 + 1;
                  }
                }
              }
            }
          }
        }
        for (s_1._4_4_ = 0; s_1._4_4_ < iVar5; s_1._4_4_ = s_1._4_4_ + 1) {
          Data2D<double>::getStrip(&this->surpluses,piVar12[s_1._4_4_]);
          pdVar10 = Utils::Wrapper2D<const_double>::getStrip
                              ((Wrapper2D<const_double> *)
                               &default_scale.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,piVar12[s_1._4_4_]
                              );
          this_01 = (Data2D<double> *)&i_2;
          Data2D<double>::getStrip(this_01,s_1._4_4_);
          bVar3 = true;
          if ((int)scale_correction_local == -1) {
            for (local_360 = 0; local_360 < (this->super_BaseCanonicalGrid).num_outputs;
                local_360 = local_360 + 1) {
              bVar4 = false;
              if (bVar3) {
                dVar2 = pdVar10[local_360];
                ::std::abs((int)this_01);
                this_01 = (Data2D<double> *)local_80;
                pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)this_01,
                                     (long)local_360);
                bVar4 = true;
                if (_output_local < (dVar2 * extraout_XMM0_Qa_01) / *pvVar11) {
                  dVar2 = pdVar10[local_360];
                  ::std::abs((int)this_01);
                  this_01 = (Data2D<double> *)local_80;
                  pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                      ((vector<double,_std::allocator<double>_> *)this_01,
                                       (long)local_360);
                  bVar4 = (dVar2 * extraout_XMM0_Qa_02) / *pvVar11 <= _output_local;
                }
              }
              bVar3 = bVar4;
            }
          }
          else {
            dVar2 = *pdVar10;
            ::std::abs((int)this_01);
            this_02 = (vector<double,_std::allocator<double>_> *)local_80;
            pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                (this_02,(long)(int)scale_correction_local);
            bVar3 = true;
            if (_output_local < (dVar2 * extraout_XMM0_Qa_03) / *pvVar11) {
              dVar2 = *pdVar10;
              ::std::abs((int)this_02);
              pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_80,
                                   (long)(int)scale_correction_local);
              bVar3 = (dVar2 * extraout_XMM0_Qa_04) / *pvVar11 <= _output_local;
            }
          }
          piVar15 = Data2D<int>::getStrip(__return_storage_ptr__,piVar12[s_1._4_4_]);
          piVar15[iVar6] = (uint)!bVar3;
        }
        Data2D<double>::~Data2D((Data2D<double> *)&i_2);
        nump = nump + 1;
      }
      ::std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&d)
      ;
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_1a8);
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_188);
      HierarchyManipulations::SplitDirections::~SplitDirections((SplitDirections *)local_168);
      Data2D<int>::~Data2D((Data2D<int> *)local_130);
    }
    local_35 = 1;
    norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_b0);
    Utils::Wrapper2D<const_double>::~Wrapper2D
              ((Wrapper2D<const_double> *)
               &default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_80);
  }
  else {
    local_35 = 1;
    norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  if ((local_35 & 1) == 0) {
    Data2D<int>::~Data2D(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}